

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softhsm2-util.cpp
# Opt level: O2

int importKeyPair(char *filePath,char *filePIN,CK_SLOT_ID slotID,char *userPIN,char *label,
                 char *objectID,int forceExec,int noPublicKey)

{
  CK_C_Login p_Var1;
  CK_SESSION_HANDLE CVar2;
  size_t objIDLen_00;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  CK_RV CVar6;
  CK_OBJECT_HANDLE CVar7;
  char *__ptr;
  size_t sStackY_160;
  CK_SESSION_HANDLE hSession;
  char *local_148;
  size_t objIDLen;
  char user_pin_copy [256];
  
  if (label == (char *)0x0) {
    pcVar5 = "ERROR: A label for the object must be supplied. Use --label <text>\n";
    sStackY_160 = 0x43;
LAB_00111be3:
    fwrite(pcVar5,sStackY_160,1,_stderr);
    return 1;
  }
  if (objectID == (char *)0x0) {
    pcVar5 = "ERROR: An ID for the object must be supplied. Use --id <hex>\n";
    sStackY_160 = 0x3d;
    goto LAB_00111be3;
  }
  objIDLen = 0;
  local_148 = filePIN;
  sVar4 = strlen(objectID);
  pcVar5 = hexStrToBin(objectID,(int)sVar4,&objIDLen);
  if (pcVar5 == (char *)0x0) {
    pcVar5 = "Please edit --id <hex> to correct error.\n";
    sStackY_160 = 0x29;
    goto LAB_00111be3;
  }
  CVar6 = (*p11->C_OpenSession)(slotID,6,(void *)0x0,(CK_NOTIFY)0x0,&hSession);
  if (CVar6 == 0) {
    iVar3 = getPW(userPIN,user_pin_copy,1);
    CVar2 = hSession;
    if (iVar3 != 0) {
      __ptr = "ERROR: Could not get user PIN\n";
      sStackY_160 = 0x1e;
      goto LAB_00111bb5;
    }
    p_Var1 = p11->C_Login;
    sVar4 = strlen(user_pin_copy);
    CVar6 = (*p_Var1)(CVar2,1,(uchar *)user_pin_copy,sVar4);
    objIDLen_00 = objIDLen;
    if (CVar6 == 0) {
      CVar7 = searchObject(hSession,3,pcVar5,objIDLen);
      if ((forceExec != 0) || (CVar7 == 0)) {
        crypto_init();
        iVar3 = crypto_import_key_pair
                          (hSession,filePath,local_148,label,pcVar5,objIDLen_00,noPublicKey);
        crypto_final();
        free(pcVar5);
        return iVar3;
      }
      free(pcVar5);
      pcVar5 = 
      "ERROR: The ID is already assigned to another object. Use --force to override this message.\n"
      ;
      sStackY_160 = 0x5b;
      goto LAB_00111be3;
    }
    if (CVar6 == 0xa0) {
      __ptr = "ERROR: The given user PIN does not match the one in the token.\n";
      sStackY_160 = 0x3f;
      goto LAB_00111bb5;
    }
    __ptr = "ERROR: Could not log in on the token.\n";
  }
  else {
    if (CVar6 != 3) {
      __ptr = "ERROR: Could not open a session on the given slot.\n";
      sStackY_160 = 0x33;
      goto LAB_00111bb5;
    }
    __ptr = "ERROR: The given slot does not exist.\n";
  }
  sStackY_160 = 0x26;
LAB_00111bb5:
  fwrite(__ptr,sStackY_160,1,_stderr);
  free(pcVar5);
  return 1;
}

Assistant:

int importKeyPair
(
	char* filePath,
	char* filePIN,
	CK_SLOT_ID slotID,
	char* userPIN,
	char* label,
	char* objectID,
	int forceExec,
	int noPublicKey
)
{
	char user_pin_copy[MAX_PIN_LEN+1];

	if (label == NULL)
	{
		fprintf(stderr, "ERROR: A label for the object must be supplied. "
				"Use --label <text>\n");
		return 1;
	}

	if (objectID == NULL)
	{
		fprintf(stderr, "ERROR: An ID for the object must be supplied. "
				"Use --id <hex>\n");
		return 1;
	}

	size_t objIDLen = 0;
	char* objID = hexStrToBin(objectID, strlen(objectID), &objIDLen);
	if (objID == NULL)
	{
		fprintf(stderr, "Please edit --id <hex> to correct error.\n");
		return 1;
	}

	CK_SESSION_HANDLE hSession;
	CK_RV rv = p11->C_OpenSession(slotID, CKF_SERIAL_SESSION | CKF_RW_SESSION,
					NULL_PTR, NULL_PTR, &hSession);
	if (rv != CKR_OK)
	{
		if (rv == CKR_SLOT_ID_INVALID)
		{
			fprintf(stderr, "ERROR: The given slot does not exist.\n");
		}
		else
		{
			fprintf(stderr, "ERROR: Could not open a session on the given slot.\n");
		}
		free(objID);
		return 1;
	}

	// Get the password
	if (getPW(userPIN, user_pin_copy, CKU_USER) != 0)
	{
		fprintf(stderr, "ERROR: Could not get user PIN\n");
		free(objID);
		return 1;
	}

	rv = p11->C_Login(hSession, CKU_USER, (CK_UTF8CHAR_PTR)user_pin_copy, strlen(user_pin_copy));
	if (rv != CKR_OK)
	{
		if (rv == CKR_PIN_INCORRECT) {
			fprintf(stderr, "ERROR: The given user PIN does not match the one in the token.\n");
		}
		else
		{
			fprintf(stderr, "ERROR: Could not log in on the token.\n");
		}
		free(objID);
		return 1;
	}

	CK_OBJECT_HANDLE oHandle = searchObject(hSession, CKO_PRIVATE_KEY, objID, objIDLen);
	if (oHandle != CK_INVALID_HANDLE && forceExec == 0)
	{
		free(objID);
		fprintf(stderr, "ERROR: The ID is already assigned to another object. "
				"Use --force to override this message.\n");
		return 1;
	}

	crypto_init();
	int result = crypto_import_key_pair(hSession, filePath, filePIN, label, objID, objIDLen, noPublicKey);
	crypto_final();

	free(objID);

	return result;
}